

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseValueTypeList
          (WastParser *this,TypeVector *out_type_list,
          unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *type_names)

{
  Var *this_00;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  Var type;
  undefined1 local_80 [40];
  int local_58;
  anon_union_32_2_9f84448a_for_Var_2 local_50;
  
  this_00 = (Var *)(local_80 + 8);
  do {
    if ((((this->options_->features).function_references_enabled_ != true) ||
        (bVar1 = PeekMatchLpar(this,Ref), !bVar1)) && (TVar2 = Peek(this,0), TVar2 != First_Type)) {
      return (Result)Ok;
    }
    Var::Var(this_00);
    RVar3 = ParseValueType(this,this_00);
    if (RVar3.enum_ == Error) {
      Var::~Var((Var *)(local_80 + 8));
      return (Result)Error;
    }
    if (local_58 == 1) {
      if ((this->options_->features).function_references_enabled_ == false) {
        __assert_fail("options_->features.function_references_enabled()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                      ,0x3bf,
                      "Result wabt::WastParser::ParseValueTypeList(TypeVector *, std::unordered_map<uint32_t, std::string> *)"
                     );
      }
      local_80._0_8_ =
           (long)(out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_long,std::__cxx11::string_const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)type_names,(Type *)local_80,&local_50);
      local_80._0_4_ = Reference;
      local_80._4_4_ = 0xffffffff;
    }
    else {
      if (local_58 != 0) {
        __assert_fail("type.is_name()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                      ,0x3be,
                      "Result wabt::WastParser::ParseValueTypeList(TypeVector *, std::unordered_map<uint32_t, std::string> *)"
                     );
      }
      local_80._4_4_ = 0xffffffff;
      local_80._0_4_ = local_50.index_;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
              (out_type_list,(Type *)local_80);
    Var::~Var(this_00);
  } while (RVar3.enum_ != Error);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseValueTypeList(
    TypeVector* out_type_list,
    std::unordered_map<uint32_t, std::string>* type_names) {
  WABT_TRACE(ParseValueTypeList);
  while (true) {
    if (!PeekMatchRefType() && !PeekMatch(TokenType::ValueType)) {
      break;
    }

    Var type;
    CHECK_RESULT(ParseValueType(&type));

    if (type.is_index()) {
      out_type_list->push_back(Type(type.index()));
    } else {
      assert(type.is_name());
      assert(options_->features.function_references_enabled());
      type_names->emplace(out_type_list->size(), type.name());
      out_type_list->push_back(Type(Type::Reference, kInvalidIndex));
    }
  }

  return Result::Ok;
}